

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O3

void Hacl_Bignum64_bn_to_bytes_le(uint32_t len,uint64_t *b,uint8_t *res)

{
  ulong __n;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  size_t __n_00;
  undefined1 *__dest;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  
  uVar2 = len - 1 & 0xfffffff8;
  uVar3 = (ulong)(uVar2 + 8);
  lVar1 = -(uVar3 + 0xf & 0xfffffffffffffff0);
  __dest = auStack_38 + lVar1;
  __n = (ulong)uVar2 + 8;
  __n_00 = 0;
  if (__n <= uVar3) {
    __n_00 = uVar3 - __n;
  }
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x195e72;
  memset(__dest + (ulong)uVar2 + 8,0,__n_00);
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x195e80;
  memcpy(__dest,b,__n);
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x195e8e;
  memcpy(res,__dest,(ulong)len);
  return;
}

Assistant:

void Hacl_Bignum64_bn_to_bytes_le(uint32_t len, uint64_t *b, uint8_t *res)
{
  uint32_t bnLen = (len - 1U) / 8U + 1U;
  uint32_t tmpLen = 8U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < bnLen; i++)
  {
    store64_le(tmp + i * 8U, b[i]);
  }
  memcpy(res, tmp, len * sizeof (uint8_t));
}